

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall QTableView::setHorizontalHeader(QTableView *this,QHeaderView *header)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  QAbstractItemModel *pQVar4;
  undefined8 uVar5;
  ConnectionType type;
  long lVar6;
  long in_FS_OFFSET;
  undefined1 local_58 [40];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((header != (QHeaderView *)0x0) &&
     (lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                        super_QWidget.field_0x8, *(QHeaderView **)(lVar1 + 0x580) != header)) {
    for (lVar6 = 0; lVar6 != 0x28; lVar6 = lVar6 + 8) {
      QObject::disconnect((Connection *)
                          ((long)&((array<QMetaObject::Connection,_5UL> *)(lVar1 + 0x600))->_M_elems
                                  [0].d_ptr + lVar6));
    }
    plVar2 = *(long **)(lVar1 + 0x580);
    if ((plVar2 != (long *)0x0) && (*(QTableView **)(plVar2[1] + 0x10) == this)) {
      (**(code **)(*plVar2 + 0x20))();
    }
    *(QHeaderView **)(lVar1 + 0x580) = header;
    QWidget::setParent((QWidget *)header,(QWidget *)this);
    QHeaderView::setFirstSectionMovable(*(QHeaderView **)(lVar1 + 0x580),true);
    pQVar4 = QAbstractItemView::model(*(QAbstractItemView **)(lVar1 + 0x580));
    if (pQVar4 == (QAbstractItemModel *)0x0) {
      (**(code **)(**(long **)(lVar1 + 0x580) + 0x1c8))
                (*(long **)(lVar1 + 0x580),*(undefined8 *)(lVar1 + 0x2f8));
      bVar3 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 800));
      if (bVar3) {
        if ((*(long *)(lVar1 + 800) == 0) || (*(int *)(*(long *)(lVar1 + 800) + 4) == 0)) {
          uVar5 = 0;
        }
        else {
          uVar5 = *(undefined8 *)(lVar1 + 0x328);
        }
        (**(code **)(**(long **)(lVar1 + 0x580) + 0x1d0))(*(long **)(lVar1 + 0x580),uVar5);
      }
    }
    type = (ConnectionType)this;
    QObject::connect<void(QHeaderView::*)(int,int,int),void(QTableView::*)(int,int,int)>
              ((Object *)local_58,*(offset_in_QHeaderView_to_subr *)(lVar1 + 0x580),
               (ContextType *)QHeaderView::sectionResized,(offset_in_QTableView_to_subr *)0x0,type);
    QObject::connect<void(QHeaderView::*)(int,int,int),void(QTableView::*)(int,int,int)>
              ((Object *)(local_58 + 8),*(offset_in_QHeaderView_to_subr *)(lVar1 + 0x580),
               (ContextType *)QHeaderView::sectionMoved,(offset_in_QTableView_to_subr *)0x0,type);
    QObject::connect<void(QHeaderView::*)(int,int),void(QTableView::*)(int,int)>
              ((Object *)(local_58 + 0x10),*(offset_in_QHeaderView_to_subr *)(lVar1 + 0x580),
               (ContextType *)QHeaderView::sectionCountChanged,(offset_in_QTableView_to_subr *)0x0,
               type);
    QObject::connect<void(QHeaderView::*)(int),void(QTableView::*)(int)>
              ((Object *)(local_58 + 0x18),*(offset_in_QHeaderView_to_subr *)(lVar1 + 0x580),
               (ContextType *)QHeaderView::sectionHandleDoubleClicked,
               (offset_in_QTableView_to_subr *)0x0,type);
    QObject::connect<void(QHeaderView::*)(),void(QTableView::*)()>
              ((Object *)(local_58 + 0x20),*(offset_in_QHeaderView_to_subr *)(lVar1 + 0x580),
               (ContextType *)QHeaderView::geometriesChanged,(offset_in_QTableView_to_subr *)0x0,
               type);
    std::array<QMetaObject::Connection,_5UL>::operator=
              ((array<QMetaObject::Connection,_5UL> *)(lVar1 + 0x600),
               (array<QMetaObject::Connection,_5UL> *)local_58);
    std::array<QMetaObject::Connection,_5UL>::~array
              ((array<QMetaObject::Connection,_5UL> *)local_58);
    setSortingEnabled(this,*(bool *)(lVar1 + 0x640));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableView::setHorizontalHeader(QHeaderView *header)
{
    Q_D(QTableView);

    if (!header || header == d->horizontalHeader)
        return;
    for (const QMetaObject::Connection &connection : d->horHeaderConnections)
        disconnect(connection);
    if (d->horizontalHeader && d->horizontalHeader->parent() == this)
        delete d->horizontalHeader;
    d->horizontalHeader = header;
    d->horizontalHeader->setParent(this);
    d->horizontalHeader->setFirstSectionMovable(true);
    if (!d->horizontalHeader->model()) {
        d->horizontalHeader->setModel(d->model);
        if (d->selectionModel)
            d->horizontalHeader->setSelectionModel(d->selectionModel);
    }

    d->horHeaderConnections = {
        connect(d->horizontalHeader,&QHeaderView::sectionResized,
                this, &QTableView::columnResized),
        connect(d->horizontalHeader, &QHeaderView::sectionMoved,
                this, &QTableView::columnMoved),
        connect(d->horizontalHeader, &QHeaderView::sectionCountChanged,
                this, &QTableView::columnCountChanged),
        connect(d->horizontalHeader, &QHeaderView::sectionHandleDoubleClicked,
                this, &QTableView::resizeColumnToContents),
        connect(d->horizontalHeader, &QHeaderView::geometriesChanged,
                this, &QTableView::updateGeometries),
    };
    //update the sorting enabled states on the new header
    setSortingEnabled(d->sortingEnabled);
}